

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t __thiscall
httplib::Stream::write_format<char_const*,char_const*>
          (Stream *this,char *fmt,char **args,char **args_1)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  ssize_t sVar3;
  ulong uVar4;
  char local_858 [8];
  array<char,_2048UL> buf;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> glowable_buf;
  
  memset(local_858,0,0x800);
  uVar1 = snprintf(local_858,0x7ff,fmt,*args,*args_1);
  if ((int)uVar1 < 1) {
    sVar3 = (ssize_t)(int)uVar1;
  }
  else {
    uVar4 = (ulong)uVar1;
    if (uVar1 < 0x7ff) {
      iVar2 = (*this->_vptr_Stream[5])(this,local_858,uVar4);
      sVar3 = CONCAT44(extraout_var,iVar2);
    }
    else {
      buf._M_elems._2040_8_ = this;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_50,0x800,
                 (allocator_type *)
                 ((long)&glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      while( true ) {
        if (uVar4 < ((long)glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start - (long)local_50) - 1U) break;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)local_50,
                   ((long)glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)local_50) * 2);
        iVar2 = snprintf((char *)local_50,
                         (size_t)(glowable_buf.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + ~(ulong)local_50),fmt,
                         *args,*args_1);
        uVar4 = (ulong)iVar2;
      }
      sVar3 = (**(code **)(*(long *)buf._M_elems._2040_8_ + 0x28))
                        (buf._M_elems._2040_8_,local_50,uVar4);
      Catch::clara::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)local_50);
    }
  }
  return sVar3;
}

Assistant:

inline ssize_t Stream::write_format(const char* fmt, const Args &...args) {
        const auto bufsiz = 2048;
        std::array<char, bufsiz> buf{};

        auto sn = snprintf(buf.data(), buf.size() - 1, fmt, args...);
        if (sn <= 0) { return sn; }

        auto n = static_cast<size_t>(sn);

        if (n >= buf.size() - 1) {
            std::vector<char> glowable_buf(buf.size());

            while (n >= glowable_buf.size() - 1) {
                glowable_buf.resize(glowable_buf.size() * 2);
                n = static_cast<size_t>(
                    snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...));
            }
            return write(&glowable_buf[0], n);
        } else {
            return write(buf.data(), n);
        }
    }